

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O1

int duckdb_shell_sqlite3_exec
              (sqlite3 *db,char *zSql,sqlite3_callback xCallback,void *pArg,char **pzErrMsg)

{
  size_t __size;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char **ppcVar6;
  char **__ptr;
  uchar *puVar7;
  int iVar8;
  char **ppcVar9;
  ulong uVar10;
  int iVar11;
  pointer str;
  ulong uVar12;
  long lVar13;
  sqlite3_callback p_Var14;
  sqlite3_stmt *pStmt;
  char *zLeftover;
  sqlite3_stmt *local_78;
  uint local_70;
  int local_6c;
  char **local_68;
  char **local_60;
  sqlite3 *local_58;
  int local_4c;
  sqlite3_callback local_48;
  char *local_40;
  void *local_38;
  sqlite3_stmt **ppStmt;
  
  if (zSql == (char *)0x0) {
    zSql = anon_var_dwarf_643533f + 9;
  }
  local_78 = (sqlite3_stmt *)0x0;
  __ptr = (char **)0x0;
  local_60 = (char **)0x0;
  local_68 = pzErrMsg;
  local_58 = db;
  local_48 = xCallback;
  local_38 = pArg;
  do {
    ppStmt = &local_78;
    pcVar5 = anon_var_dwarf_643533f + 9;
    if (*zSql == '\0') {
      iVar3 = 0;
      goto LAB_0022a459;
    }
    local_78 = (sqlite3_stmt *)0x0;
    iVar3 = duckdb_shell_sqlite3_prepare_v2(db,zSql,-1,ppStmt,&local_40);
    iVar8 = (int)ppStmt;
    if (iVar3 == 0) {
      if (local_78 == (sqlite3_stmt *)0x0) {
        iVar3 = 0;
        zSql = local_40;
        iVar4 = 2;
      }
      else {
        local_70 = duckdb_shell_sqlite3_column_count(local_78);
        lVar13 = (long)(int)local_70;
        __size = lVar13 * 8;
        ppcVar6 = (char **)malloc(__size);
        __ptr = (char **)malloc(__size);
        iVar3 = 0;
        ppcVar9 = (char **)CONCAT71((int7)((ulong)ppStmt >> 8),
                                    __ptr == (char **)0x0 || ppcVar6 == (char **)0x0);
        iVar8 = (int)ppcVar9;
        pzErrMsg = local_68;
        iVar4 = 4;
        local_60 = ppcVar6;
        if (__ptr != (char **)0x0 && ppcVar6 != (char **)0x0) {
          uVar12 = (ulong)local_70;
          if (0 < (int)local_70) {
            uVar10 = 0;
            do {
              pcVar5 = duckdb_shell_sqlite3_column_name(local_78,(int)uVar10);
              ppcVar6[uVar10] = pcVar5;
              uVar10 = uVar10 + 1;
            } while (uVar12 != uVar10);
          }
          bVar2 = 0 < (int)local_70;
          p_Var14 = local_48;
          do {
            iVar3 = duckdb_shell_sqlite3_step(local_78);
            iVar8 = (int)ppcVar9;
            if (iVar3 == 100 && p_Var14 != (sqlite3_callback)0x0) {
              local_4c = 10;
              bVar1 = bVar2;
              if (0 < (int)local_70) {
                uVar10 = 0;
                local_6c = iVar3;
                do {
                  puVar7 = duckdb_shell_sqlite3_column_text(local_78,(int)uVar10);
                  __ptr[uVar10] = (char *)puVar7;
                  if (puVar7 == (uchar *)0x0) {
                    iVar3 = duckdb_shell_sqlite3_column_type(local_78,(int)uVar10);
                    iVar8 = (int)ppcVar9;
                    if (iVar3 != 5) {
                      duckdb_shell_sqlite3_exec_cold_1();
                      local_4c = 4;
                      p_Var14 = local_48;
                      iVar3 = local_6c;
                      break;
                    }
                  }
                  iVar8 = (int)ppcVar9;
                  uVar10 = uVar10 + 1;
                  bVar1 = (long)uVar10 < lVar13;
                  p_Var14 = local_48;
                  iVar3 = local_6c;
                } while (uVar12 != uVar10);
              }
              if (bVar1) {
                iVar3 = 100;
                db = local_58;
                pzErrMsg = local_68;
                iVar4 = local_4c;
                goto LAB_0022a40e;
              }
              ppcVar9 = local_60;
              iVar4 = (*p_Var14)(local_38,local_70,__ptr,local_60);
              iVar8 = (int)ppcVar9;
              if (iVar4 != 0) {
                duckdb_shell_sqlite3_exec_cold_2();
                iVar3 = 4;
                db = local_58;
                pzErrMsg = local_68;
                iVar4 = 4;
                goto LAB_0022a40e;
              }
            }
            db = local_58;
            iVar8 = (int)ppcVar9;
          } while (iVar3 == 100);
          if (iVar3 == 0x65) {
            local_6c = duckdb_shell_sqlite3_finalize(local_78);
            db = local_58;
            local_78 = (sqlite3_stmt *)0x0;
            zSql = local_40 + -1;
            do {
              pcVar5 = zSql + 1;
              zSql = zSql + 1;
              iVar3 = isspace((int)*pcVar5);
              iVar8 = (int)ppcVar9;
            } while (iVar3 != 0);
            free(local_60);
            free(__ptr);
            local_60 = (char **)0x0;
            __ptr = (char **)0x0;
            pzErrMsg = local_68;
            iVar4 = 0;
            iVar3 = local_6c;
          }
          else {
            if (local_68 != (char **)0x0) {
              str = anon_var_dwarf_643533f + 9;
              if (local_58 != (sqlite3 *)0x0) {
                str = (local_58->last_error).final_message._M_dataplus._M_p;
              }
              if (str == (char *)0x0) {
                pcVar5 = (char *)0x0;
              }
              else {
                pcVar5 = sqlite3_strdup(str);
              }
              iVar11 = 4;
              pzErrMsg = local_68;
              goto LAB_0022a2f8;
            }
            pzErrMsg = local_68;
            iVar4 = 4;
          }
        }
      }
    }
    else {
      iVar11 = 2;
      iVar4 = 2;
      if (pzErrMsg != (char **)0x0) {
        if (db != (sqlite3 *)0x0) {
          pcVar5 = (db->last_error).final_message._M_dataplus._M_p;
        }
        if (pcVar5 == (char *)0x0) {
          pcVar5 = (char *)0x0;
        }
        else {
          pcVar5 = sqlite3_strdup(pcVar5);
          iVar11 = 2;
          db = local_58;
        }
LAB_0022a2f8:
        *pzErrMsg = pcVar5;
        iVar4 = iVar11;
      }
    }
LAB_0022a40e:
    if ((iVar4 != 0) && (iVar4 != 2)) {
      if (iVar4 != 4) {
        return iVar8;
      }
      goto LAB_0022a459;
    }
    if (iVar3 != 0) {
LAB_0022a459:
      if (local_78 != (sqlite3_stmt *)0x0) {
        duckdb_shell_sqlite3_finalize(local_78);
      }
      free(local_60);
      free(__ptr);
      if (((pzErrMsg != (char **)0x0) && (iVar3 != 0)) && (*pzErrMsg == (char *)0x0)) {
        pcVar5 = sqlite3_strdup("Unknown error in DuckDB!");
        *pzErrMsg = pcVar5;
      }
      return iVar3;
    }
  } while( true );
}

Assistant:

int sqlite3_exec(sqlite3 *db,                /* The database on which the SQL executes */
                 const char *zSql,           /* The SQL to be executed */
                 sqlite3_callback xCallback, /* Invoke this callback routine */
                 void *pArg,                 /* First argument to xCallback() */
                 char **pzErrMsg             /* Write error messages here */
) {
	int rc = SQLITE_OK;            /* Return code */
	const char *zLeftover;         /* Tail of unprocessed SQL */
	sqlite3_stmt *pStmt = nullptr; /* The current SQL statement */
	char **azCols = nullptr;       /* Names of result columns */
	char **azVals = nullptr;       /* Result values */

	if (zSql == nullptr) {
		zSql = "";
	}

	while (rc == SQLITE_OK && zSql[0]) {
		int nCol;

		pStmt = nullptr;
		rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, &zLeftover);
		if (rc != SQLITE_OK) {
			if (pzErrMsg) {
				auto errmsg = sqlite3_errmsg(db);
				*pzErrMsg = errmsg ? sqlite3_strdup(errmsg) : nullptr;
			}
			continue;
		}
		if (!pStmt) {
			/* this happens for a comment or white-space */
			zSql = zLeftover;
			continue;
		}

		nCol = sqlite3_column_count(pStmt);
		azCols = (char **)malloc(nCol * sizeof(const char *));
		azVals = (char **)malloc(nCol * sizeof(const char *));
		if (!azCols || !azVals) {
			goto exec_out;
		}
		for (int i = 0; i < nCol; i++) {
			azCols[i] = (char *)sqlite3_column_name(pStmt, i);
		}

		while (true) {
			rc = sqlite3_step(pStmt);

			/* Invoke the callback function if required */
			if (xCallback && rc == SQLITE_ROW) {
				for (int i = 0; i < nCol; i++) {
					azVals[i] = (char *)sqlite3_column_text(pStmt, i);
					if (!azVals[i] && sqlite3_column_type(pStmt, i) != SQLITE_NULL) {
						fprintf(stderr, "sqlite3_exec: out of memory.\n");
						goto exec_out;
					}
				}
				if (xCallback(pArg, nCol, azVals, azCols)) {
					/* EVIDENCE-OF: R-38229-40159 If the callback function to
					** sqlite3_exec() returns non-zero, then sqlite3_exec() will
					** return SQLITE_ABORT. */
					rc = SQLITE_ABORT;
					sqlite3_finalize(pStmt);
					pStmt = 0;
					fprintf(stderr, "sqlite3_exec: callback returned non-zero. "
					                "Aborting.\n");
					goto exec_out;
				}
			}
			if (rc == SQLITE_DONE) {
				rc = sqlite3_finalize(pStmt);
				pStmt = nullptr;
				zSql = zLeftover;
				while (isspace(zSql[0]))
					zSql++;
				break;
			} else if (rc != SQLITE_ROW) {
				// error
				if (pzErrMsg) {
					auto errmsg = sqlite3_errmsg(db);
					*pzErrMsg = errmsg ? sqlite3_strdup(errmsg) : nullptr;
				}
				goto exec_out;
			}
		}

		sqlite3_free(azCols);
		sqlite3_free(azVals);
		azCols = nullptr;
		azVals = nullptr;
	}

exec_out:
	if (pStmt) {
		sqlite3_finalize(pStmt);
	}
	sqlite3_free(azCols);
	sqlite3_free(azVals);
	if (rc != SQLITE_OK && pzErrMsg && !*pzErrMsg) {
		// error but no error message set
		*pzErrMsg = sqlite3_strdup("Unknown error in DuckDB!");
	}
	return rc;
}